

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::split
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this)

{
  DataFlowState *this_00;
  DataFlowState copied;
  DataFlowState local_200;
  DataFlowState local_160;
  DataFlowState local_c0;
  
  if (this->isStateSplit == false) {
    DataFlowAnalysis::copyState(&local_c0,(DataFlowAnalysis *)this,&this->state);
    this_00 = &local_160;
    DataFlowState::DataFlowState(this_00,&local_c0);
    DataFlowState::DataFlowState(&local_200,&this->state);
    setConditionalState(this,this_00,&local_200);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_200
               ,(EVP_PKEY_CTX *)this_00);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_160
               ,(EVP_PKEY_CTX *)this_00);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_c0,
               (EVP_PKEY_CTX *)this_00);
  }
  return;
}

Assistant:

void split() {
        if (!isStateSplit) {
            auto copied = (DERIVED).copyState(state);
            setConditionalState(std::move(copied), std::move(state));
        }
    }